

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_post_effects.cpp
# Opt level: O3

void __thiscall
ON_PostEffects::GetPostEffects(ON_PostEffects *this,ON_SimpleArray<const_ON_PostEffect_*> *a)

{
  CImpl *this_00;
  long lVar1;
  long lVar2;
  
  this_00 = this->_impl;
  CImpl::EnsurePopulated(this_00);
  if (0 < (this_00->_peps).m_count) {
    lVar2 = 0;
    lVar1 = 0;
    do {
      ON_SimpleArray<const_ON_PostEffect_*>::Append
                (a,(ON_PostEffect **)((long)(this_00->_peps).m_a + lVar2));
      lVar1 = lVar1 + 1;
      lVar2 = lVar2 + 8;
    } while (lVar1 < (this_00->_peps).m_count);
  }
  return;
}

Assistant:

void ON_PostEffects::GetPostEffects(ON_SimpleArray<const ON_PostEffect*>& a) const
{
  const auto& pel = _impl->PostEffectList();

  for (int i = 0; i < pel.Count(); i++)
  {
    a.Append(pel[i]);
  }
}